

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::prepare(WasmBinaryWriter *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Signature,_unsigned_int>,_false,_true>,_bool>
  pVar4;
  undefined1 local_a8 [24];
  Signature local_90;
  pair<const_wasm::Signature,_unsigned_int> local_80;
  uint local_68;
  uint local_64;
  Index size;
  Index i;
  WasmBinaryWriter *local_10;
  WasmBinaryWriter *this_local;
  
  local_10 = this;
  wasm::ModuleUtils::getOptimizedIndexedHeapTypes((IndexedHeapTypes *)&size,this->wasm);
  wasm::ModuleUtils::IndexedHeapTypes::operator=(&this->indexedTypes,(IndexedHeapTypes *)&size);
  wasm::ModuleUtils::IndexedHeapTypes::~IndexedHeapTypes((IndexedHeapTypes *)&size);
  local_64 = 0;
  sVar2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                    (&(this->indexedTypes).types);
  local_68 = (uint)sVar2;
  for (; local_64 < local_68; local_64 = local_64 + 1) {
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       (&(this->indexedTypes).types,(ulong)local_64);
    bVar1 = HeapType::isSignature(pvVar3);
    if (bVar1) {
      pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         (&(this->indexedTypes).types,(ulong)local_64);
      local_90 = HeapType::getSignature(pvVar3);
      std::pair<const_wasm::Signature,_unsigned_int>::pair<wasm::Signature,_unsigned_int_&,_true>
                (&local_80,&local_90,&local_64);
      pVar4 = std::
              unordered_map<wasm::Signature,_unsigned_int,_std::hash<wasm::Signature>,_std::equal_to<wasm::Signature>,_std::allocator<std::pair<const_wasm::Signature,_unsigned_int>_>_>
              ::insert(&this->signatureIndexes,&local_80);
      local_a8._8_8_ =
           pVar4.first.
           super__Node_iterator_base<std::pair<const_wasm::Signature,_unsigned_int>,_true>._M_cur;
      local_a8[0x10] = pVar4.second;
    }
  }
  std::make_unique<wasm::ImportInfo,wasm::Module&>((Module *)local_a8);
  std::unique_ptr<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>::operator=
            (&this->importInfo,
             (unique_ptr<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_> *)local_a8);
  std::unique_ptr<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>::~unique_ptr
            ((unique_ptr<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_> *)local_a8);
  return;
}

Assistant:

void WasmBinaryWriter::prepare() {
  // Collect function types and their frequencies. Collect information in each
  // function in parallel, then merge.
  indexedTypes = ModuleUtils::getOptimizedIndexedHeapTypes(*wasm);
  for (Index i = 0, size = indexedTypes.types.size(); i < size; ++i) {
    if (indexedTypes.types[i].isSignature()) {
      signatureIndexes.insert({indexedTypes.types[i].getSignature(), i});
    }
  }
  importInfo = std::make_unique<ImportInfo>(*wasm);
}